

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O1

void __thiscall
deqp::gls::ShaderExecUtil::FragmentOutExecutor::execute
          (FragmentOutExecutor *this,int numValues,void **inputs,void **outputs)

{
  DataType dataType;
  pointer ppSVar1;
  pointer pVVar2;
  RenderContext *pRVar3;
  void *__dest;
  ulong uVar4;
  bool bVar5;
  undefined4 uVar6;
  FragmentOutExecutor *pFVar7;
  int iVar8;
  uint uVar9;
  deUint32 dVar10;
  int iVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *pOVar13;
  undefined4 extraout_var_01;
  pointer pSVar14;
  pointer ppSVar15;
  TextureFormat TVar16;
  uint *puVar17;
  NotSupportedError *this_00;
  TestError *this_01;
  ulong uVar18;
  pointer key;
  int iVar19;
  long lVar20;
  float fVar21;
  float fVar22;
  int value;
  string attribName;
  vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> vertexArrays;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> positions;
  Framebuffer framebuffer;
  RenderbufferVector renderbuffers;
  undefined1 local_1a0 [8];
  long *local_198;
  long local_190;
  long local_188;
  void *local_180;
  int local_178;
  int local_16c;
  undefined1 local_168 [8];
  _Alloc_hider local_160;
  undefined1 local_158 [24];
  int local_140;
  VertexArrayPointer local_138;
  Type local_118;
  uint local_114;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  void **local_f0;
  ulong local_e8;
  int local_dc;
  FragmentOutExecutor *local_d8;
  ulong local_d0;
  vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> local_c8;
  ulong local_b0;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> local_a8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_90;
  void **local_88;
  long local_80;
  size_t local_78;
  ObjectWrapper local_70;
  ObjectVector local_58;
  long lVar12;
  
  local_f0 = inputs;
  local_88 = outputs;
  iVar8 = (*((this->super_ShaderExecutor).m_renderCtx)->_vptr_RenderContext[3])();
  lVar12 = CONCAT44(extraout_var,iVar8);
  local_114 = (*((this->super_ShaderExecutor).m_renderCtx)->_vptr_RenderContext[2])();
  local_168._0_4_ = TYPE_LOCATION;
  (**(code **)(lVar12 + 0x868))(0x84e8,local_168);
  uVar6 = local_168._0_4_;
  local_118 = numValues;
  if ((int)local_168._0_4_ < numValues) {
    local_118 = local_168._0_4_;
  }
  local_16c = (numValues / (int)local_118 + 1) - (uint)(numValues % (int)local_118 == 0);
  iVar8 = (*((this->super_ShaderExecutor).m_renderCtx)->_vptr_RenderContext[3])();
  pOVar13 = glu::objectTraits(OBJECTTYPE_FRAMEBUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_70,(Functions *)CONCAT44(extraout_var_00,iVar8),pOVar13);
  ppSVar15 = (this->m_outputLayout).locationSymbols.
             super__Vector_base<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::allocator<const_deqp::gls::ShaderExecUtil::Symbol_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  ppSVar1 = (this->m_outputLayout).locationSymbols.
            super__Vector_base<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::allocator<const_deqp::gls::ShaderExecUtil::Symbol_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  iVar8 = (*((this->super_ShaderExecutor).m_renderCtx)->_vptr_RenderContext[3])();
  pOVar13 = glu::objectTraits(OBJECTTYPE_RENDERBUFFER);
  glu::ObjectVector::ObjectVector
            (&local_58,(Functions *)CONCAT44(extraout_var_01,iVar8),pOVar13,
             (long)ppSVar15 - (long)ppSVar1 >> 3);
  local_c8.super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
  _M_impl.super__Vector_impl_data._M_start = (VertexArrayBinding *)0x0;
  local_c8.super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
            (&local_a8,(long)numValues,(allocator_type *)local_168);
  if ((int)uVar6 < local_16c) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_168,"Value count is too high for maximum supported renderbuffer size"
               ,"");
    tcu::NotSupportedError::NotSupportedError(this_00,(string *)local_168);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  local_b0 = (ulong)(uint)numValues;
  if (0 < numValues) {
    uVar18 = 0;
    do {
      uVar4 = (ulong)(uint)((int)uVar18 >> 0x1f) << 0x20 | uVar18 & 0xffffffff;
      fVar21 = ((float)(int)((long)uVar4 % (long)(int)local_118) + 0.5) / (float)(int)local_118;
      fVar22 = ((float)(int)((long)uVar4 / (long)(int)local_118) + 0.5) / (float)local_16c;
      local_a8.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar18].m_data[0] = fVar21 + fVar21 + -1.0;
      local_a8.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar18].m_data[1] = fVar22 + fVar22 + -1.0;
      uVar18 = uVar18 + 1;
    } while (local_b0 != uVar18);
  }
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"a_position","");
  pVVar2 = local_a8.
           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_1a0._0_4_ = A;
  local_198 = &local_188;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_198,local_110._M_dataplus._M_p,
             local_110._M_dataplus._M_p + local_110._M_string_length);
  local_178 = 0;
  local_168._0_4_ = local_1a0._0_4_;
  local_160._M_p = local_158 + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_160,local_198,local_190 + (long)local_198);
  local_140 = local_178;
  local_138.componentType = VTX_COMP_FLOAT;
  local_138.convert = VTX_COMP_CONVERT_NONE;
  local_138.numComponents = 2;
  local_138.stride = 0;
  local_138.data = pVVar2;
  local_138.numElements = numValues;
  if (local_198 != &local_188) {
    operator_delete(local_198,local_188 + 1);
  }
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
  emplace_back<glu::VertexArrayBinding>(&local_c8,(VertexArrayBinding *)local_168);
  if (local_160._M_p != local_158 + 8) {
    operator_delete(local_160._M_p,local_158._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  pSVar14 = (this->super_ShaderExecutor).m_inputs.
            super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_d8 = this;
  if (0 < (int)((ulong)((long)(this->super_ShaderExecutor).m_inputs.
                              super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar14) >> 3) *
          -0x49249249) {
    lVar20 = 0;
    do {
      std::operator+(&local_110,"a_",&pSVar14[lVar20].name);
      pVVar2 = (pointer)local_f0[lVar20];
      dataType = pSVar14[lVar20].varType.m_data.basic.type;
      iVar8 = glu::getDataTypeScalarSize(dataType);
      if (dataType - TYPE_FLOAT < 4) {
        local_1a0._0_4_ = A;
        local_198 = &local_188;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_198,local_110._M_dataplus._M_p,
                   local_110._M_dataplus._M_p + local_110._M_string_length);
        local_178 = 0;
        local_168._0_4_ = local_1a0._0_4_;
        local_160._M_p = local_158 + 8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_160,local_198,local_190 + (long)local_198);
        local_140 = local_178;
        local_138.componentType = VTX_COMP_FLOAT;
        local_138.convert = VTX_COMP_CONVERT_NONE;
        local_138.stride = 0;
        local_138.numComponents = iVar8;
        local_138.numElements = numValues;
        local_138.data = pVVar2;
        if (local_198 != &local_188) {
          operator_delete(local_198,local_188 + 1);
        }
        std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
        emplace_back<glu::VertexArrayBinding>(&local_c8,(VertexArrayBinding *)local_168);
LAB_00812b1b:
        if (local_160._M_p != local_158 + 8) {
          operator_delete(local_160._M_p,local_158._8_8_ + 1);
        }
      }
      else {
        if (dataType - TYPE_INT < 4) {
          local_1a0._0_4_ = A;
          local_198 = &local_188;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_198,local_110._M_dataplus._M_p,
                     local_110._M_dataplus._M_p + local_110._M_string_length);
          local_178 = 0;
          local_168._0_4_ = local_1a0._0_4_;
          local_160._M_p = local_158 + 8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_160,local_198,local_190 + (long)local_198);
          local_140 = local_178;
          local_138.componentType = VTX_COMP_SIGNED_INT32;
          local_138.convert = VTX_COMP_CONVERT_NONE;
          local_138.stride = 0;
          local_138.numComponents = iVar8;
          local_138.numElements = numValues;
          local_138.data = pVVar2;
          if (local_198 != &local_188) {
            operator_delete(local_198,local_188 + 1);
          }
          std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
          emplace_back<glu::VertexArrayBinding>(&local_c8,(VertexArrayBinding *)local_168);
          goto LAB_00812b1b;
        }
        if (dataType - TYPE_UINT < 4) {
          local_1a0._0_4_ = A;
          local_198 = &local_188;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_198,local_110._M_dataplus._M_p,
                     local_110._M_dataplus._M_p + local_110._M_string_length);
          local_178 = 0;
          local_168._0_4_ = local_1a0._0_4_;
          local_160._M_p = local_158 + 8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_160,local_198,local_190 + (long)local_198);
          local_140 = local_178;
          local_138.componentType = VTX_COMP_UNSIGNED_INT32;
          local_138.convert = VTX_COMP_CONVERT_NONE;
          local_138.stride = 0;
          local_138.numComponents = iVar8;
          local_138.numElements = numValues;
          local_138.data = pVVar2;
          if (local_198 != &local_188) {
            operator_delete(local_198,local_188 + 1);
          }
          std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
          emplace_back<glu::VertexArrayBinding>(&local_c8,(VertexArrayBinding *)local_168);
          goto LAB_00812b1b;
        }
        if (dataType - TYPE_FLOAT_MAT2 < 9 || dataType - TYPE_DOUBLE_MAT2 < 9) {
          iVar8 = glu::getDataTypeMatrixNumRows(dataType);
          uVar9 = glu::getDataTypeMatrixNumColumns(dataType);
          if (0 < (int)uVar9) {
            iVar19 = iVar8 * uVar9 * 4;
            local_e8 = (ulong)uVar9;
            iVar11 = 0;
            uVar18 = 0;
            do {
              local_1a0._0_4_ = A;
              local_198 = &local_188;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_198,local_110._M_dataplus._M_p,
                         local_110._M_dataplus._M_p + local_110._M_string_length);
              local_178 = (int)uVar18;
              local_168._0_4_ = local_1a0._0_4_;
              local_160._M_p = local_158 + 8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_160,local_198,local_190 + (long)local_198);
              local_138.data = pVVar2->m_data + iVar11;
              local_140 = local_178;
              local_138.componentType = VTX_COMP_FLOAT;
              local_138.convert = VTX_COMP_CONVERT_NONE;
              local_138.numComponents = iVar8;
              local_138.numElements = numValues;
              local_138.stride = iVar19;
              if (local_198 != &local_188) {
                operator_delete(local_198,local_188 + 1);
              }
              std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
              emplace_back<glu::VertexArrayBinding>(&local_c8,(VertexArrayBinding *)local_168);
              if (local_160._M_p != local_158 + 8) {
                operator_delete(local_160._M_p,local_158._8_8_ + 1);
              }
              uVar18 = uVar18 + 1;
              iVar11 = iVar11 + iVar8;
            } while (local_e8 != uVar18);
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      lVar20 = lVar20 + 1;
      pSVar14 = (local_d8->super_ShaderExecutor).m_inputs.
                super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (lVar20 < (int)((ulong)((long)(local_d8->super_ShaderExecutor).m_inputs.
                                          super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar14
                                   ) >> 3) * -0x49249249);
  }
  pFVar7 = local_d8;
  (**(code **)(lVar12 + 0x78))(0x8d40,local_70.m_object);
  local_114 = local_114 & 0x300;
  ppSVar15 = (pFVar7->m_outputLayout).locationSymbols.
             super__Vector_base<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::allocator<const_deqp::gls::ShaderExecUtil::Symbol_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(pFVar7->m_outputLayout).locationSymbols.
                              super__Vector_base<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::allocator<const_deqp::gls::ShaderExecUtil::Symbol_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar15) >> 3)) {
    lVar20 = 0;
    do {
      uVar9 = local_58.m_objects.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar20];
      TVar16 = getRenderbufferFormatForOutput(&ppSVar15[lVar20]->varType,local_114 != 0x100);
      dVar10 = glu::getInternalFormat(TVar16);
      (**(code **)(lVar12 + 0xa0))(0x8d41,uVar9);
      (**(code **)(lVar12 + 0x1238))(0x8d41,dVar10,local_118,local_16c);
      (**(code **)(lVar12 + 0x688))(0x8d40,(int)lVar20 + 0x8ce0,0x8d41,uVar9);
      lVar20 = lVar20 + 1;
      ppSVar15 = (pFVar7->m_outputLayout).locationSymbols.
                 super__Vector_base<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::allocator<const_deqp::gls::ShaderExecUtil::Symbol_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    } while (lVar20 < (int)((ulong)((long)(pFVar7->m_outputLayout).locationSymbols.
                                          super__Vector_base<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::allocator<const_deqp::gls::ShaderExecUtil::Symbol_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)ppSVar15) >> 3));
  }
  (**(code **)(lVar12 + 0xa0))(0x8d41,0);
  dVar10 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar10,"Failed to set up framebuffer object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderExecUtil.cpp"
                  ,0x27e);
  iVar8 = (**(code **)(lVar12 + 0x170))(0x8d40);
  if (iVar8 != 0x8cd5) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,(char *)0x0,
               "gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderExecUtil.cpp"
               ,0x27f);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_168,
             (long)(pFVar7->m_outputLayout).locationSymbols.
                   super__Vector_base<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::allocator<const_deqp::gls::ShaderExecUtil::Symbol_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(pFVar7->m_outputLayout).locationSymbols.
                   super__Vector_base<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::allocator<const_deqp::gls::ShaderExecUtil::Symbol_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)local_1a0);
  uVar9 = (uint)((ulong)((long)(pFVar7->m_outputLayout).locationSymbols.
                               super__Vector_base<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::allocator<const_deqp::gls::ShaderExecUtil::Symbol_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pFVar7->m_outputLayout).locationSymbols.
                              super__Vector_base<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::allocator<const_deqp::gls::ShaderExecUtil::Symbol_*>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3);
  if (0 < (int)uVar9) {
    uVar18 = 0;
    do {
      *(uint *)((long)local_168 + uVar18 * 4) = (int)uVar18 + 0x8ce0;
      uVar18 = uVar18 + 1;
    } while ((uVar9 & 0x7fffffff) != uVar18);
  }
  (**(code **)(lVar12 + 0x560))((ulong)((long)local_160._M_p - (long)local_168) >> 2);
  dVar10 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar10,"glDrawBuffers()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderExecUtil.cpp"
                  ,0x286);
  if ((TextureFormat)local_168 != (TextureFormat)0x0) {
    operator_delete((void *)local_168,local_158._0_8_ - (long)local_168);
  }
  (**(code **)(lVar12 + 0x1a00))(0,0,local_118,local_16c);
  pRVar3 = (pFVar7->super_ShaderExecutor).m_renderCtx;
  dVar10 = (*(pFVar7->super_ShaderExecutor)._vptr_ShaderExecutor[4])(pFVar7);
  local_168._4_4_ = numValues;
  local_168._0_4_ = 6;
  local_160._M_p._0_4_ = 3;
  local_158._0_8_ = (pointer)0x0;
  glu::draw(pRVar3,dVar10,
            (int)((ulong)((long)local_c8.
                                super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_c8.
                               super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x33333333,
            local_c8.
            super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
            _M_impl.super__Vector_impl_data._M_start,(PrimitiveList *)local_168,
            (DrawUtilCallback *)0x0);
  dVar10 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar10,"Error in draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderExecUtil.cpp"
                  ,0x28d);
  tcu::TextureLevel::TextureLevel((TextureLevel *)local_168);
  pSVar14 = (pFVar7->super_ShaderExecutor).m_outputs.
            super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(pFVar7->super_ShaderExecutor).m_outputs.
                              super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar14) >> 3) *
          -0x49249249) {
    local_90 = &(pFVar7->m_outputLayout).locationMap;
    local_b0 = local_b0 << 2;
    lVar20 = 0;
    do {
      iVar8 = glu::VarType::getScalarSize(&pSVar14[lVar20].varType);
      key = pSVar14 + lVar20;
      local_dc = glu::getDataTypeNumComponents((key->varType).m_data.basic.type);
      iVar11 = glu::getDataTypeNumLocations((key->varType).m_data.basic.type);
      local_f0 = (void **)CONCAT44(local_f0._4_4_,iVar11);
      __dest = local_88[lVar20];
      TVar16 = getRenderbufferFormatForOutput(&pSVar14[lVar20].varType,local_114 != 0x100);
      local_110._M_dataplus._M_p._4_4_ = TVar16.type;
      local_110._M_dataplus._M_p._0_4_ = 8;
      local_80 = lVar20;
      puVar17 = (uint *)de::
                        lookup<std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>>
                                  (local_90,&key->name);
      local_d0 = (ulong)*puVar17;
      tcu::TextureLevel::setStorage
                ((TextureLevel *)local_168,(TextureFormat *)&local_110,local_118,local_16c,1);
      if (0 < (int)local_f0) {
        local_d0 = (ulong)((int)local_d0 + 0x8ce0);
        bVar5 = (int)local_f0 == 1;
        lVar20 = (long)local_dc;
        local_78 = (long)(local_dc * numValues) << 2;
        local_e8 = local_e8 & 0xffffffff00000000;
        iVar11 = 0;
        do {
          (**(code **)(lVar12 + 0x1218))((int)local_d0 + iVar11);
          pRVar3 = (local_d8->super_ShaderExecutor).m_renderCtx;
          tcu::TextureLevel::getAccess((PixelBufferAccess *)local_1a0,(TextureLevel *)local_168);
          glu::readPixels(pRVar3,0,0,(PixelBufferAccess *)local_1a0);
          dVar10 = (**(code **)(lVar12 + 0x800))();
          glu::checkError(dVar10,"Reading pixels",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderExecUtil.cpp"
                          ,0x2a6);
          if (bVar5 && iVar8 == 4) {
            tcu::TextureLevel::getAccess((PixelBufferAccess *)local_1a0,(TextureLevel *)local_168);
            memcpy(__dest,local_180,local_78);
          }
          else if (0 < numValues) {
            uVar18 = 0;
            iVar19 = (int)local_e8;
            do {
              tcu::TextureLevel::getAccess((PixelBufferAccess *)local_1a0,(TextureLevel *)local_168)
              ;
              memcpy((void *)((long)iVar19 * 4 + (long)__dest),
                     (void *)((long)(int)uVar18 * 4 + (long)local_180),lVar20 * 4);
              iVar19 = iVar19 + iVar8;
              uVar18 = uVar18 + 4;
            } while (local_b0 != uVar18);
          }
          iVar11 = iVar11 + 1;
          local_e8 = CONCAT44(local_e8._4_4_,(int)local_e8 + local_dc);
        } while (iVar11 != (int)local_f0);
      }
      lVar20 = local_80 + 1;
      pSVar14 = (local_d8->super_ShaderExecutor).m_outputs.
                super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (lVar20 < (int)((ulong)((long)(local_d8->super_ShaderExecutor).m_outputs.
                                          super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar14
                                   ) >> 3) * -0x49249249);
  }
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_168);
  (**(code **)(lVar12 + 0x78))(0x8d40,0);
  if (local_a8.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::~vector(&local_c8)
  ;
  glu::ObjectVector::~ObjectVector(&local_58);
  glu::ObjectWrapper::~ObjectWrapper(&local_70);
  return;
}

Assistant:

void FragmentOutExecutor::execute (int numValues, const void* const* inputs, void* const* outputs)
{
	const glw::Functions&			gl					= m_renderCtx.getFunctions();
	const bool						useIntOutputs		= !hasFloatRenderTargets(m_renderCtx);
	const int						maxRenderbufferSize	= queryInt(gl, GL_MAX_RENDERBUFFER_SIZE);
	const int						framebufferW		= de::min(maxRenderbufferSize, numValues);
	const int						framebufferH		= (numValues / framebufferW) + ((numValues % framebufferW != 0) ? 1 : 0);

	glu::Framebuffer				framebuffer			(m_renderCtx);
	glu::RenderbufferVector			renderbuffers		(m_renderCtx, m_outputLayout.locationSymbols.size());

	vector<glu::VertexArrayBinding>	vertexArrays;
	vector<tcu::Vec2>				positions			(numValues);

	if (framebufferH > maxRenderbufferSize)
		throw tcu::NotSupportedError("Value count is too high for maximum supported renderbuffer size");

	// Compute positions - 1px points are used to drive fragment shading.
	for (int valNdx = 0; valNdx < numValues; valNdx++)
	{
		const int		ix		= valNdx % framebufferW;
		const int		iy		= valNdx / framebufferW;
		const float		fx		= -1.0f + 2.0f*((float(ix) + 0.5f) / float(framebufferW));
		const float		fy		= -1.0f + 2.0f*((float(iy) + 0.5f) / float(framebufferH));

		positions[valNdx] = tcu::Vec2(fx, fy);
	}

	// Vertex inputs.
	vertexArrays.push_back(glu::va::Float("a_position", 2, numValues, 0, (const float*)&positions[0]));

	for (int inputNdx = 0; inputNdx < (int)m_inputs.size(); inputNdx++)
	{
		const Symbol&		symbol		= m_inputs[inputNdx];
		const std::string	attribName	= "a_" + symbol.name;
		const void*			ptr			= inputs[inputNdx];
		const glu::DataType	basicType	= symbol.varType.getBasicType();
		const int			vecSize		= glu::getDataTypeScalarSize(basicType);

		if (glu::isDataTypeFloatOrVec(basicType))
			vertexArrays.push_back(glu::va::Float(attribName, vecSize, numValues, 0, (const float*)ptr));
		else if (glu::isDataTypeIntOrIVec(basicType))
			vertexArrays.push_back(glu::va::Int32(attribName, vecSize, numValues, 0, (const deInt32*)ptr));
		else if (glu::isDataTypeUintOrUVec(basicType))
			vertexArrays.push_back(glu::va::Uint32(attribName, vecSize, numValues, 0, (const deUint32*)ptr));
		else if (glu::isDataTypeMatrix(basicType))
		{
			int		numRows	= glu::getDataTypeMatrixNumRows(basicType);
			int		numCols	= glu::getDataTypeMatrixNumColumns(basicType);
			int		stride	= numRows * numCols * (int)sizeof(float);

			for (int colNdx = 0; colNdx < numCols; ++colNdx)
				vertexArrays.push_back(glu::va::Float(attribName, colNdx, numRows, numValues, stride, ((const float*)ptr) + colNdx * numRows));
		}
		else
			DE_ASSERT(false);
	}

	// Construct framebuffer.
	gl.bindFramebuffer(GL_FRAMEBUFFER, *framebuffer);

	for (int outNdx = 0; outNdx < (int)m_outputLayout.locationSymbols.size(); ++outNdx)
	{
		const Symbol&	output			= *m_outputLayout.locationSymbols[outNdx];
		const deUint32	renderbuffer	= renderbuffers[outNdx];
		const deUint32	format			= glu::getInternalFormat(getRenderbufferFormatForOutput(output.varType, useIntOutputs));

		gl.bindRenderbuffer(GL_RENDERBUFFER, renderbuffer);
		gl.renderbufferStorage(GL_RENDERBUFFER, format, framebufferW, framebufferH);
		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0+outNdx, GL_RENDERBUFFER, renderbuffer);
	}
	gl.bindRenderbuffer(GL_RENDERBUFFER, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to set up framebuffer object");
	TCU_CHECK(gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE);

	{
		vector<deUint32> drawBuffers(m_outputLayout.locationSymbols.size());
		for (int ndx = 0; ndx < (int)m_outputLayout.locationSymbols.size(); ndx++)
			drawBuffers[ndx] = GL_COLOR_ATTACHMENT0+ndx;
		gl.drawBuffers((int)drawBuffers.size(), &drawBuffers[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawBuffers()");
	}

	// Render
	gl.viewport(0, 0, framebufferW, framebufferH);
	glu::draw(m_renderCtx, this->getProgram(), (int)vertexArrays.size(), &vertexArrays[0],
			  glu::pr::Points(numValues));
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error in draw");

	// Read back pixels.
	{
		tcu::TextureLevel	tmpBuf;

		// \todo [2013-08-07 pyry] Some fast-paths could be added here.

		for (int outNdx = 0; outNdx < (int)m_outputs.size(); ++outNdx)
		{
			const Symbol&				output			= m_outputs[outNdx];
			const int					outSize			= output.varType.getScalarSize();
			const int					outVecSize		= glu::getDataTypeNumComponents(output.varType.getBasicType());
			const int					outNumLocs		= glu::getDataTypeNumLocations(output.varType.getBasicType());
			deUint32*					dstPtrBase		= static_cast<deUint32*>(outputs[outNdx]);
			const tcu::TextureFormat	format			= getRenderbufferFormatForOutput(output.varType, useIntOutputs);
			const tcu::TextureFormat	readFormat		(tcu::TextureFormat::RGBA, format.type);
			const int					outLocation		= de::lookup(m_outputLayout.locationMap, output.name);

			tmpBuf.setStorage(readFormat, framebufferW, framebufferH);

			for (int locNdx = 0; locNdx < outNumLocs; ++locNdx)
			{
				gl.readBuffer(GL_COLOR_ATTACHMENT0 + outLocation + locNdx);
				glu::readPixels(m_renderCtx, 0, 0, tmpBuf.getAccess());
				GLU_EXPECT_NO_ERROR(gl.getError(), "Reading pixels");

				if (outSize == 4 && outNumLocs == 1)
					deMemcpy(dstPtrBase, tmpBuf.getAccess().getDataPtr(), numValues*outVecSize*sizeof(deUint32));
				else
				{
					for (int valNdx = 0; valNdx < numValues; valNdx++)
					{
						const deUint32* srcPtr = (const deUint32*)tmpBuf.getAccess().getDataPtr() + valNdx*4;
						deUint32*		dstPtr = &dstPtrBase[outSize*valNdx + outVecSize*locNdx];
						deMemcpy(dstPtr, srcPtr, outVecSize*sizeof(deUint32));
					}
				}
			}
		}
	}

	// \todo [2013-08-07 pyry] Clear draw buffers & viewport?
	gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
}